

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O1

MockSpec<void_(char_*,_unsigned_long)> * __thiscall
testing::internal::FunctionMocker<void_(char_*,_unsigned_long)>::With
          (FunctionMocker<void_(char_*,_unsigned_long)> *this,Matcher<char_*> *m1,
          Matcher<unsigned_long> *m2)

{
  linked_ptr<const_testing::MatcherInterface<char_*>_> *ptr;
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_> *ptr_00;
  tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
  local_48;
  
  std::tr1::
  tuple<testing::Matcher<char_*>,_testing::Matcher<unsigned_long>,_void,_void,_void,_void,_void,_void,_void,_void>
  ::tuple(&local_48,m1,m2);
  ptr = &local_48.f0_.super_MatcherBase<char_*>.impl_;
  linked_ptr<const_testing::MatcherInterface<char_*>_>::operator=
            (&(this->super_FunctionMockerBase<void_(char_*,_unsigned_long)>).current_spec_.matchers_
              .f0_.super_MatcherBase<char_*>.impl_,ptr);
  ptr_00 = &local_48.f1_.super_MatcherBase<unsigned_long>.impl_;
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::operator=
            (&(this->super_FunctionMockerBase<void_(char_*,_unsigned_long)>).current_spec_.matchers_
              .f1_.super_MatcherBase<unsigned_long>.impl_,ptr_00);
  local_48.f1_.super_MatcherBase<unsigned_long>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002a62e0;
  linked_ptr<const_testing::MatcherInterface<unsigned_long>_>::~linked_ptr(ptr_00);
  local_48.f0_.super_MatcherBase<char_*>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_002a6610;
  linked_ptr<const_testing::MatcherInterface<char_*>_>::~linked_ptr(ptr);
  return &(this->super_FunctionMockerBase<void_(char_*,_unsigned_long)>).current_spec_;
}

Assistant:

MockSpec<F>& With(const Matcher<A1>& m1, const Matcher<A2>& m2) {
    this->current_spec().SetMatchers(::std::tr1::make_tuple(m1, m2));
    return this->current_spec();
  }